

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnect_on_signal.cpp
# Opt level: O1

int main(void)

{
  __sighandler_t __handler;
  int __sig;
  A a;
  signal<void_()> signal;
  signal<void_()> local_80;
  
  local_80.super_signal_base._vptr_signal_base = (_func_int **)&PTR__signal_00104d80;
  local_80.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__align = 0;
  local_80.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._8_8_ = 0;
  local_80.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._16_8_ = 0;
  local_80.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  local_80.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_80.m_slots.m_first._0_5_ = 0;
  local_80.m_slots.m_first._5_3_ = 0;
  local_80.m_slots.m_last._0_5_ = 0;
  local_80.m_slots._53_8_ = 0;
  std::condition_variable::condition_variable(&local_80.m_slots.m_delete_cv);
  __sig = 0x101548;
  obs::signal<void_()>::connect<A>(&local_80,0x101548,(A *)0x0);
  obs::signal<void_()>::operator()<>(&local_80);
  obs::signal<void_()>::operator()<>(&local_80);
  obs::signal<void_()>::~signal(&local_80,__sig,__handler);
  return 0;
}

Assistant:

int main() {
  obs::signal<void()> signal;
  {
    A a(signal);
    signal();
  }
  signal();
}